

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proof.cc
# Opt level: O2

void __thiscall gss::innards::Proof::finish_unsat_proof(Proof *this)

{
  long *plVar1;
  _Head_base<0UL,_gss::innards::Proof::Imp_*,_false> _Var2;
  ostream *poVar3;
  
  std::operator<<((ostream *)
                  (((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  proof_stream)._M_t,"* asserting that we\'ve proved unsat\n");
  std::operator<<((ostream *)
                  (((this->_imp)._M_t.
                    super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
                    .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl)->
                  proof_stream)._M_t,"u >= 1 ;\n");
  _Var2._M_head_impl =
       (this->_imp)._M_t.
       super___uniq_ptr_impl<gss::innards::Proof::Imp,_std::default_delete<gss::innards::Proof::Imp>_>
       ._M_t.
       super__Tuple_impl<0UL,_gss::innards::Proof::Imp_*,_std::default_delete<gss::innards::Proof::Imp>_>
       .super__Head_base<0UL,_gss::innards::Proof::Imp_*,_false>._M_head_impl;
  plVar1 = &(_Var2._M_head_impl)->proof_line;
  *plVar1 = *plVar1 + 1;
  poVar3 = std::operator<<((ostream *)((_Var2._M_head_impl)->proof_stream)._M_t,"output NONE\n");
  poVar3 = std::operator<<(poVar3,"conclusion UNSAT : -1\n");
  std::operator<<(poVar3,"end pseudo-Boolean proof\n");
  return;
}

Assistant:

auto Proof::finish_unsat_proof() -> void
{
    *_imp->proof_stream << "* asserting that we've proved unsat\n";
    *_imp->proof_stream << "u >= 1 ;\n";
    ++_imp->proof_line;
    *_imp->proof_stream << "output NONE\n"
                        << "conclusion UNSAT : -1\n"
                        << "end pseudo-Boolean proof\n";
}